

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::Calc_Sxi_xi_compact
          (ChElementShellANCF_3443 *this,VectorN *Sxi_xi_compact,double xi,double eta,double zeta,
          double thickness,double zoffset)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar29 [64];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qb;
  undefined8 in_XMM4_Qb;
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  auVar29._8_56_ = in_register_00001248;
  auVar29._0_8_ = eta;
  auVar26._8_56_ = in_register_00001208;
  auVar26._0_8_ = xi;
  auVar22 = auVar29._0_16_;
  auVar19 = vfmadd213sd_fma(auVar22,auVar22,auVar22);
  dVar3 = eta + -1.0;
  auVar24 = auVar26._0_16_;
  auVar17 = vfmadd213sd_avx512f(ZEXT816(0x4008000000000000),auVar24,ZEXT816(0x3ff0000000000000));
  auVar4 = vfmadd213sd_fma(ZEXT816(0x4008000000000000),auVar24,ZEXT816(0xbff0000000000000));
  auVar34._8_8_ = 0;
  auVar34._0_8_ = xi * 3.0;
  auVar19 = vfmadd231sd_fma(auVar19,auVar34,auVar24);
  auVar18 = vaddsd_avx512f(auVar19,ZEXT816(0xc008000000000000));
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar3 * -0.125;
  auVar19 = vmulsd_avx512f(auVar33,auVar18);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0] = auVar19._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = this->m_lenX;
  auVar19 = vmulsd_avx512f(ZEXT816(0xbfb0000000000000),auVar19);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[1] = (xi + -1.0) * auVar19._0_8_ * auVar17._0_8_ * dVar3;
  auVar20 = vaddsd_avx512f(auVar22,ZEXT816(0x3ff0000000000000));
  auVar21 = vaddsd_avx512f(auVar24,ZEXT816(0x3ff0000000000000));
  auVar19 = vfmsub213sd_fma(auVar22,auVar22,auVar22);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = this->m_lenY;
  auVar22 = vmulsd_avx512f(ZEXT816(0xbfb0000000000000),auVar22);
  dVar31 = auVar20._0_8_;
  auVar19 = vfmadd231sd_fma(auVar19,auVar34,auVar24);
  auVar23 = vaddsd_avx512f(auVar19,ZEXT816(0xc008000000000000));
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[2] = dVar31 * auVar22._0_8_ * dVar3 * dVar3;
  auVar32 = ZEXT816(0xc000000000000000);
  auVar13._8_8_ = in_XMM4_Qb;
  auVar13._0_8_ = zoffset;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = this->m_thicknessZ;
  auVar19 = vfmadd231sd_avx512f(auVar36,auVar13,auVar32);
  auVar8._8_8_ = in_XMM3_Qb;
  auVar8._0_8_ = thickness;
  auVar19 = vsubsd_avx512f(auVar19,auVar8);
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = zeta;
  auVar9._8_8_ = in_XMM3_Qb;
  auVar9._0_8_ = thickness;
  auVar19 = vfnmadd231sd_avx512f(auVar19,auVar9,auVar5);
  auVar19 = vmulsd_avx512f(auVar33,auVar19);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar3;
  auVar22 = vmulsd_avx512f(auVar30,ZEXT816(0x3fc0000000000000));
  auVar18 = vmulsd_avx512f(auVar22,auVar18);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[3] = auVar19._0_8_;
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).
           m_storage.m_data.array + 4;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->m_lenX;
  auVar19 = vmulsd_avx512f(ZEXT816(0xbfb0000000000000),auVar18);
  auVar19 = vmulsd_avx512f(auVar21,auVar19);
  auVar19 = vmulsd_avx512f(auVar4,auVar19);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[5] = auVar19._0_8_ * dVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = this->m_lenY;
  auVar19 = vmulsd_avx512f(ZEXT816(0x3fb0000000000000),auVar24);
  auVar19 = vmulsd_avx512f(auVar20,auVar19);
  auVar19 = vmulsd_avx512f(auVar30,auVar19);
  auVar19 = vmulsd_avx512f(auVar30,auVar19);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).
           m_storage.m_data.array + 6;
  vmovsd_avx512f(auVar19);
  *pdVar1 = *pdVar1;
  auVar14._8_8_ = in_XMM4_Qb;
  auVar14._0_8_ = zoffset;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = this->m_thicknessZ;
  auVar19 = vfmadd231sd_avx512f(auVar35,auVar14,auVar32);
  auVar10._8_8_ = in_XMM3_Qb;
  auVar10._0_8_ = thickness;
  auVar19 = vsubsd_avx512f(auVar19,auVar10);
  auVar6._8_8_ = in_XMM2_Qb;
  auVar6._0_8_ = zeta;
  auVar11._8_8_ = in_XMM3_Qb;
  auVar11._0_8_ = thickness;
  auVar19 = vfnmadd231sd_avx512f(auVar19,auVar11,auVar6);
  auVar19 = vmulsd_avx512f(auVar22,auVar19);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar19);
  *pdVar1 = *pdVar1;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[8] = dVar31 * -0.125 * auVar23._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->m_lenX;
  auVar19 = vmulsd_avx512f(ZEXT816(0x3fb0000000000000),auVar2);
  auVar19 = vmulsd_avx512f(auVar21,auVar19);
  auVar22 = vmulsd_avx512f(auVar20,ZEXT816(0x3fc0000000000000));
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[9] = dVar31 * auVar4._0_8_ * auVar19._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_lenY;
  auVar19 = vmulsd_avx512f(ZEXT816(0x3fb0000000000000),auVar4);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[10] = dVar31 * dVar31 * dVar3 * auVar19._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = this->m_thicknessZ;
  auVar15._8_8_ = in_XMM4_Qb;
  auVar15._0_8_ = zoffset;
  auVar19 = vfmadd231sd_fma(auVar27,auVar15,auVar32);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar19._0_8_ - thickness;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = zeta;
  auVar12._8_8_ = in_XMM3_Qb;
  auVar12._0_8_ = thickness;
  auVar19 = vfnmadd231sd_fma(auVar28,auVar12,auVar7);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xb] = dVar31 * -0.125 * auVar19._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xc] = auVar22._0_8_ * auVar23._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = this->m_lenX;
  auVar19 = vmulsd_avx512f(ZEXT816(0x3fb0000000000000),auVar20);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xd] = dVar31 * (xi + -1.0) * auVar17._0_8_ * auVar19._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->m_lenY;
  auVar19 = vmulsd_avx512f(ZEXT816(0xbfb0000000000000),auVar17);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xe] = dVar31 * dVar31 * dVar3 * auVar19._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = this->m_thicknessZ;
  auVar16._8_8_ = in_XMM4_Qb;
  auVar16._0_8_ = zoffset;
  auVar19 = vfmadd213sd_fma(auVar32,auVar16,auVar21);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar19._0_8_ - thickness;
  auVar23._8_8_ = in_XMM2_Qb;
  auVar23._0_8_ = zeta;
  auVar32._8_8_ = in_XMM3_Qb;
  auVar32._0_8_ = thickness;
  auVar19 = vfnmadd231sd_fma(auVar25,auVar32,auVar23);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xf] = auVar22._0_8_ * auVar19._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3443::Calc_Sxi_xi_compact(VectorN& Sxi_xi_compact,
                                                  double xi,
                                                  double eta,
                                                  double zeta,
                                                  double thickness,
                                                  double zoffset) {
    Sxi_xi_compact(0) = -0.125 * (eta - 1) * (eta * eta + eta + 3 * xi * xi - 3);
    Sxi_xi_compact(1) = -0.0625 * m_lenX * (3 * xi + 1) * (xi - 1) * (eta - 1);
    Sxi_xi_compact(2) = -0.0625 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1);
    Sxi_xi_compact(3) = -0.125 * (eta - 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);

    Sxi_xi_compact(4) = 0.125 * (eta - 1) * (eta * eta + eta + 3 * xi * xi - 3);
    Sxi_xi_compact(5) = -0.0625 * m_lenX * (xi + 1) * (3 * xi - 1) * (eta - 1);
    Sxi_xi_compact(6) = 0.0625 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1);
    Sxi_xi_compact(7) = 0.125 * (eta - 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);

    Sxi_xi_compact(8) = -0.125 * (eta + 1) * (eta * eta - eta + 3 * xi * xi - 3);
    Sxi_xi_compact(9) = 0.0625 * m_lenX * (xi + 1) * (3 * xi - 1) * (eta + 1);
    Sxi_xi_compact(10) = 0.0625 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1);
    Sxi_xi_compact(11) = -0.125 * (eta + 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);

    Sxi_xi_compact(12) = 0.125 * (eta + 1) * (eta * eta - eta + 3 * xi * xi - 3);
    Sxi_xi_compact(13) = 0.0625 * m_lenX * (3 * xi + 1) * (xi - 1) * (eta + 1);
    Sxi_xi_compact(14) = -0.0625 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1);
    Sxi_xi_compact(15) = 0.125 * (eta + 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
}